

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_scalingFactorBetweenUnitsSameNameLostChildren_Test::TestBody
          (Units_scalingFactorBetweenUnitsSameNameLostChildren_Test *this)

{
  char *pcVar1;
  double local_88;
  AssertHelper local_80 [8];
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr model2;
  AssertionResult gtest_ar;
  ModelPtr model1;
  double scaling;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model2,"model1",(allocator<char> *)&u1);
  libcellml::Model::create((string *)&model1);
  std::__cxx11::string::~string((string *)&model2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model2,"units",(allocator<char> *)&u2);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)&model2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model2,"oranges",(allocator<char> *)&u2);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&model2);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::clone();
  libcellml::Model::units((ulong)&u2);
  scaling = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  local_88 = 0.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0","scaling",&local_88,&scaling);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa54,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenUnitsSameNameLostChildren)
{
    auto model1 = libcellml::Model::create("model1");
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("oranges");
    model1->addUnits(u1);

    auto model2 = model1->clone();
    auto u2 = model2->units(0);

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(0.0, scaling);
}